

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeIdxKeyCompare(sqlite3 *db,VdbeCursor *pC,UnpackedRecord *pUnpacked,int *res)

{
  u32 amt;
  int iVar1;
  undefined1 local_80 [8];
  Mem m;
  BtCursor *pCur;
  int rc;
  i64 nCellKey;
  int *res_local;
  UnpackedRecord *pUnpacked_local;
  VdbeCursor *pC_local;
  sqlite3 *db_local;
  
  m.xDel = (_func_void_void_ptr *)(pC->uc).pCursor;
  amt = sqlite3BtreePayloadSize((BtCursor *)m.xDel);
  if ((amt == 0) || (0x7fffffff < amt)) {
    *res = 0;
    db_local._4_4_ = sqlite3CorruptError(0x15b4f);
  }
  else {
    sqlite3VdbeMemInit((Mem *)local_80,db,0);
    db_local._4_4_ = sqlite3VdbeMemFromBtreeZeroOffset((BtCursor *)m.xDel,amt,(Mem *)local_80);
    if (db_local._4_4_ == 0) {
      iVar1 = sqlite3VdbeRecordCompareWithSkip((int)m.z,m.u.zPType,pUnpacked,0);
      *res = iVar1;
      sqlite3VdbeMemReleaseMalloc((Mem *)local_80);
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeIdxKeyCompare(
  sqlite3 *db,                     /* Database connection */
  VdbeCursor *pC,                  /* The cursor to compare against */
  UnpackedRecord *pUnpacked,       /* Unpacked version of key */
  int *res                         /* Write the comparison result here */
){
  i64 nCellKey = 0;
  int rc;
  BtCursor *pCur;
  Mem m;

  assert( pC->eCurType==CURTYPE_BTREE );
  pCur = pC->uc.pCursor;
  assert( sqlite3BtreeCursorIsValid(pCur) );
  nCellKey = sqlite3BtreePayloadSize(pCur);
  /* nCellKey will always be between 0 and 0xffffffff because of the way
  ** that btreeParseCellPtr() and sqlite3GetVarint32() are implemented */
  if( nCellKey<=0 || nCellKey>0x7fffffff ){
    *res = 0;
    return SQLITE_CORRUPT_BKPT;
  }
  sqlite3VdbeMemInit(&m, db, 0);
  rc = sqlite3VdbeMemFromBtreeZeroOffset(pCur, (u32)nCellKey, &m);
  if( rc ){
    return rc;
  }
  *res = sqlite3VdbeRecordCompareWithSkip(m.n, m.z, pUnpacked, 0);
  sqlite3VdbeMemReleaseMalloc(&m);
  return SQLITE_OK;
}